

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (unsigned_long *args,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  longlong lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  longlong *in_RSI;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  basic_string_view<char> *arg_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  basic_string_view<char> *arg_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  basic_string_view<char> *arg_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  ulong_type *arg;
  undefined1 local_209;
  char *local_208;
  size_t sStack_200;
  char **local_1f8;
  char *local_1e8 [2];
  char *local_1d8;
  size_t sStack_1d0;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  char *local_1b8;
  size_t sStack_1b0;
  char **local_1a8;
  char *local_198 [2];
  char *local_188;
  size_t sStack_180;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  char *local_168;
  size_t sStack_160;
  char **local_158;
  char *local_148 [4];
  undefined1 *local_128;
  basic_string_view<char> local_120;
  undefined1 *local_108;
  basic_string_view<char> local_100;
  undefined1 *local_e8;
  basic_string_view<char> local_e0;
  char **local_d0;
  basic_string_view<char> local_c8;
  char **local_b8;
  basic_string_view<char> local_b0;
  char **local_a0;
  basic_string_view<char> local_98;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  longlong local_80;
  longlong *local_78;
  undefined1 local_68 [8];
  size_t local_60;
  longlong local_50;
  undefined1 *local_48;
  longlong local_40;
  undefined1 *local_38;
  
  lVar1 = *in_RSI;
  local_38 = &local_81;
  local_78 = &local_80;
  local_82 = 1;
  local_83 = 1;
  local_84 = 1;
  local_85 = 1;
  local_48 = local_68;
  local_128 = &local_169;
  local_80 = lVar1;
  local_50 = lVar1;
  local_40 = lVar1;
  local_120 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x19dff2);
  local_168 = local_120.data_;
  sStack_160 = local_120.size_;
  local_158 = &local_168;
  local_16a = 1;
  local_16b = 1;
  local_16c = 1;
  local_16d = 1;
  local_188 = local_120.data_;
  sStack_180 = local_120.size_;
  local_d0 = local_148;
  local_c8.data_ = local_188;
  local_c8.size_ = sStack_180;
  local_148[0] = basic_string_view<char>::data(&local_c8);
  sVar2 = basic_string_view<char>::size(&local_c8);
  local_108 = &local_1b9;
  local_100 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x19e130);
  local_1b8 = local_100.data_;
  sStack_1b0 = local_100.size_;
  local_1a8 = &local_1b8;
  local_1ba = 1;
  local_1bb = 1;
  local_1bc = 1;
  local_1bd = 1;
  local_1d8 = local_100.data_;
  sStack_1d0 = local_100.size_;
  local_b8 = local_198;
  local_b0.data_ = local_1d8;
  local_b0.size_ = sStack_1d0;
  local_198[0] = basic_string_view<char>::data(&local_b0);
  sVar3 = basic_string_view<char>::size(&local_b0);
  local_e8 = &local_209;
  local_e0 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x19e26a);
  local_208 = local_e0.data_;
  sStack_200 = local_e0.size_;
  local_1f8 = &local_208;
  local_98.data_ = local_e0.data_;
  local_98.size_ = local_e0.size_;
  local_a0 = local_1e8;
  local_1e8[0] = basic_string_view<char>::data(&local_98);
  sVar4 = basic_string_view<char>::size(&local_98);
  (in_RDI->data_).args_[0].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[0].field_0.string.size = local_60;
  (in_RDI->data_).args_[1].field_0.string.data = local_148[0];
  (in_RDI->data_).args_[1].field_0.string.size = sVar2;
  (in_RDI->data_).args_[2].field_0.string.data = local_198[0];
  (in_RDI->data_).args_[2].field_0.string.size = sVar3;
  (in_RDI->data_).args_[3].field_0.string.data = local_1e8[0];
  (in_RDI->data_).args_[3].field_0.string.size = sVar4;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}